

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::FeatureType::MergePartialFromCodedStream
          (FeatureType *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  int iVar6;
  uint32 uVar7;
  Int64FeatureType *this_00;
  unsigned_long uVar8;
  StringFeatureType *this_01;
  DoubleFeatureType *this_02;
  ArrayFeatureType *this_03;
  ImageFeatureType *this_04;
  DictionaryFeatureType *this_05;
  SequenceFeatureType *this_06;
  pair<int,_int> pVar9;
  char cVar10;
  uint uVar11;
  Limit limit;
  ulong uVar12;
  CodedInputStream *pCVar13;
  pair<unsigned_long,_bool> pVar14;
  
LAB_001e49f0:
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar12 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar11 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar11, (~(uint)*pbVar1 & uVar11) < 0x80))
        goto LAB_001e4f1a;
        uVar12 = (ulong)((uVar11 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar12 = uVar12 | 0x100000000;
    }
    else {
LAB_001e4f1a:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    uVar7 = (uint32)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto LAB_001e4a4d;
    uVar11 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar12;
    switch(uVar11) {
    case 1:
      if (cVar10 != '\n') break;
      if (this->_oneof_case_[0] != 1) {
        clear_Type(this);
        this->_oneof_case_[0] = 1;
        this_00 = (Int64FeatureType *)operator_new(0x18);
        Int64FeatureType::Int64FeatureType(this_00);
        (this->Type_).int64type_ = this_00;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pCVar13 = input;
      pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar5 = Int64FeatureType::MergePartialFromCodedStream((Int64FeatureType *)pCVar13,input);
LAB_001e4e99:
      if (bVar5 == false) {
        return false;
      }
      limit = pVar9.first;
LAB_001e4f0b:
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,limit);
      goto LAB_001e4f10;
    case 2:
      if (cVar10 == '\x12') {
        if (this->_oneof_case_[0] != 2) {
          clear_Type(this);
          this->_oneof_case_[0] = 2;
          this_02 = (DoubleFeatureType *)operator_new(0x18);
          DoubleFeatureType::DoubleFeatureType(this_02);
          (this->Type_).doubletype_ = this_02;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pCVar13 = input;
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar5 = DoubleFeatureType::MergePartialFromCodedStream((DoubleFeatureType *)pCVar13,input);
        goto LAB_001e4e99;
      }
      break;
    case 3:
      if (cVar10 == '\x1a') {
        if (this->_oneof_case_[0] != 3) {
          clear_Type(this);
          this->_oneof_case_[0] = 3;
          this_01 = (StringFeatureType *)operator_new(0x18);
          StringFeatureType::StringFeatureType(this_01);
          (this->Type_).stringtype_ = this_01;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pCVar13 = input;
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar5 = StringFeatureType::MergePartialFromCodedStream((StringFeatureType *)pCVar13,input);
        goto LAB_001e4e99;
      }
      break;
    case 4:
      if (cVar10 == '\"') {
        if (this->_oneof_case_[0] == 4) {
          this_04 = (this->Type_).imagetype_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 4;
          this_04 = (ImageFeatureType *)operator_new(0x38);
          ImageFeatureType::ImageFeatureType(this_04);
          (this->Type_).imagetype_ = this_04;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar5 = ImageFeatureType::MergePartialFromCodedStream(this_04,input);
LAB_001e4f01:
        if (bVar5 == false) {
          return false;
        }
        limit = pVar9.first;
        goto LAB_001e4f0b;
      }
      break;
    case 5:
      if (cVar10 == '*') {
        if (this->_oneof_case_[0] == 5) {
          this_03 = (this->Type_).multiarraytype_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 5;
          this_03 = (ArrayFeatureType *)operator_new(0x48);
          ArrayFeatureType::ArrayFeatureType(this_03);
          (this->Type_).multiarraytype_ = this_03;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar5 = ArrayFeatureType::MergePartialFromCodedStream(this_03,input);
        goto LAB_001e4f01;
      }
      break;
    case 6:
      if (cVar10 == '2') {
        if (this->_oneof_case_[0] == 6) {
          this_05 = (this->Type_).dictionarytype_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 6;
          this_05 = (DictionaryFeatureType *)operator_new(0x20);
          DictionaryFeatureType::DictionaryFeatureType(this_05);
          (this->Type_).dictionarytype_ = this_05;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar5 = DictionaryFeatureType::MergePartialFromCodedStream(this_05,input);
        goto LAB_001e4f01;
      }
      break;
    case 7:
      if (cVar10 == ':') {
        if (this->_oneof_case_[0] == 7) {
          this_06 = (this->Type_).sequencetype_;
        }
        else {
          clear_Type(this);
          this->_oneof_case_[0] = 7;
          this_06 = (SequenceFeatureType *)operator_new(0x28);
          SequenceFeatureType::SequenceFeatureType(this_06);
          (this->Type_).sequencetype_ = this_06;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar5 = SequenceFeatureType::MergePartialFromCodedStream(this_06,input);
        goto LAB_001e4f01;
      }
      break;
    default:
      if ((uVar11 == 1000) && (cVar10 == '@')) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar4, -1 < (long)uVar8)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar14.first;
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->isoptional_ = uVar8 != 0;
        goto LAB_001e49f0;
      }
    }
LAB_001e4a4d:
    if (uVar7 == 0) {
      return true;
    }
    if ((uVar7 & 7) == 4) {
      return true;
    }
    bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
LAB_001e4f10:
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool FeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.FeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Int64FeatureType int64Type = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleFeatureType doubleType = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_doubletype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringFeatureType stringType = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringtype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ImageFeatureType imageType = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imagetype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType multiArrayType = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_multiarraytype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DictionaryFeatureType dictionaryType = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dictionarytype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SequenceFeatureType sequenceType = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sequencetype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isOptional = 1000;
      case 1000: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8000u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isoptional_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.FeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.FeatureType)
  return false;
#undef DO_
}